

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Name __thiscall wasm::MultiMemoryLowering::getOffsetGlobal(MultiMemoryLowering *this,Index idx)

{
  pointer pNVar1;
  Name NVar2;
  
  if (idx != 0) {
    pNVar1 = (this->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_start;
    NVar2.super_IString.str._M_str = pNVar1[idx - 1].super_IString.str._M_str;
    NVar2.super_IString.str._M_len = pNVar1[idx - 1].super_IString.str._M_len;
    return (Name)NVar2.super_IString.str;
  }
  return (IString)ZEXT816(0);
}

Assistant:

Name getOffsetGlobal(Index idx) {
    // There is no offset global for the first memory
    if (idx == 0) {
      return Name();
    }

    // Since there is no offset global for the first memory, we need to
    // subtract one when indexing into the offsetGlobalName vector
    return offsetGlobalNames[idx - 1];
  }